

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gather.cpp
# Opt level: O0

void duckdb::TemplatedGatherLoop<unsigned_char>
               (Vector *rows,SelectionVector *row_sel,Vector *col,SelectionVector *col_sel,
               idx_t count,RowLayout *layout,idx_t col_no,idx_t build_size)

{
  uchar uVar1;
  bool bVar2;
  const_reference pvVar3;
  SelectionVector *in_RCX;
  SelectionVector *in_RSI;
  ulong in_R8;
  RowLayout *in_R9;
  idx_t in_stack_00000008;
  ulong in_stack_00000010;
  ValidityBytes row_mask;
  idx_t col_idx;
  uchar *row;
  idx_t row_idx;
  idx_t i;
  ValidityMask *col_mask;
  uchar *data;
  uchar **ptrs;
  idx_t idx_in_entry;
  idx_t entry_idx;
  value_type col_offset;
  vector<unsigned_long,_true> *offsets;
  size_type in_stack_ffffffffffffff28;
  vector<unsigned_long,_true> *in_stack_ffffffffffffff30;
  TemplatedValidityMask<unsigned_long> *this;
  TemplatedValidityMask<unsigned_char> *this_00;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uchar local_a9;
  TemplatedValidityMask<unsigned_char> local_a8;
  idx_t local_88;
  TemplatedValidityMask<unsigned_long> *local_80;
  idx_t local_78;
  ulong local_70;
  TemplatedValidityMask<unsigned_long> *local_68;
  uchar *local_60;
  uchar **local_58;
  idx_t local_50;
  idx_t local_48;
  value_type local_40;
  vector<unsigned_long,_true> *local_38;
  ulong local_28;
  SelectionVector *local_20;
  SelectionVector *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_38 = RowLayout::GetOffsets(in_R9);
  pvVar3 = vector<unsigned_long,_true>::operator[]
                     (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_40 = *pvVar3;
  TemplatedValidityMask<unsigned_char>::GetEntryIndex(in_stack_00000008,&local_48,&local_50);
  local_58 = FlatVector::GetData<unsigned_char*>((Vector *)0x1591596);
  local_60 = FlatVector::GetData<unsigned_char>((Vector *)0x15915ab);
  local_68 = &FlatVector::Validity((Vector *)0x15915bd)->super_TemplatedValidityMask<unsigned_long>;
  for (local_70 = 0; local_70 < local_28; local_70 = local_70 + 1) {
    local_78 = SelectionVector::get_index(local_10,local_70);
    local_80 = (TemplatedValidityMask<unsigned_long> *)local_58[local_78];
    local_88 = SelectionVector::get_index(local_20,local_70);
    uVar1 = Load<unsigned_char>((const_data_ptr_t)((long)&local_80->validity_mask + local_40));
    local_60[local_88] = uVar1;
    this = local_80;
    RowLayout::ColumnCount((RowLayout *)0x159165d);
    this_00 = &local_a8;
    TemplatedValidityMask<unsigned_char>::TemplatedValidityMask
              ((TemplatedValidityMask<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),(uchar *)this_00,
               (idx_t)this);
    local_a9 = TemplatedValidityMask<unsigned_char>::GetValidityEntry(this_00,(idx_t)this);
    in_stack_ffffffffffffff40 = CONCAT13(local_a9,(int3)in_stack_ffffffffffffff40);
    bVar2 = TemplatedValidityMask<unsigned_char>::RowIsValid(&local_a9,&local_50);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      if ((0x800 < in_stack_00000010) &&
         (bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_68), bVar2)) {
        TemplatedValidityMask<unsigned_long>::Initialize
                  ((TemplatedValidityMask<unsigned_long> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),(idx_t)this_00);
      }
      TemplatedValidityMask<unsigned_long>::SetInvalid(this,in_stack_ffffffffffffff28);
    }
    TemplatedValidityMask<unsigned_char>::~TemplatedValidityMask
              ((TemplatedValidityMask<unsigned_char> *)0x1591719);
  }
  return;
}

Assistant:

static void TemplatedGatherLoop(Vector &rows, const SelectionVector &row_sel, Vector &col,
                                const SelectionVector &col_sel, idx_t count, const RowLayout &layout, idx_t col_no,
                                idx_t build_size) {
	// Precompute mask indexes
	const auto &offsets = layout.GetOffsets();
	const auto col_offset = offsets[col_no];
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_no, entry_idx, idx_in_entry);

	auto ptrs = FlatVector::GetData<data_ptr_t>(rows);
	auto data = FlatVector::GetData<T>(col);
	auto &col_mask = FlatVector::Validity(col);

	for (idx_t i = 0; i < count; i++) {
		auto row_idx = row_sel.get_index(i);
		auto row = ptrs[row_idx];
		auto col_idx = col_sel.get_index(i);
		data[col_idx] = Load<T>(row + col_offset);
		ValidityBytes row_mask(row, layout.ColumnCount());
		if (!row_mask.RowIsValid(row_mask.GetValidityEntry(entry_idx), idx_in_entry)) {
			if (build_size > STANDARD_VECTOR_SIZE && col_mask.AllValid()) {
				//! We need to initialize the mask with the vector size.
				col_mask.Initialize(build_size);
			}
			col_mask.SetInvalid(col_idx);
		}
	}
}